

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# microtar.c
# Opt level: O1

int memory_seek(mtar_t *tar,size_t offset)

{
  int iVar1;
  
  iVar1 = -5;
  if ((tar->stream != (void *)0x0) && (offset <= tar->memory_size)) {
    tar->memory_pos = offset;
    iVar1 = 0;
  }
  return iVar1;
}

Assistant:

static int memory_seek(mtar_t *tar, size_t offset) {
  if (!tar->stream)
    return MTAR_ESEEKFAIL;

  if (offset > tar->memory_size)
    return MTAR_ESEEKFAIL;

  tar->memory_pos = offset;
  return MTAR_ESUCCESS;
}